

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pasteboard.c
# Opt level: O2

void wpe_pasteboard_string_initialize
               (wpe_pasteboard_string *string,char *in_string,uint64_t in_length)

{
  char *__dest;
  uint in_ECX;
  
  if (string->data != (char *)0x0) {
    return;
  }
  __dest = (char *)wpe_calloc_impl(in_length,1,(char *)0x29,in_ECX);
  string->data = __dest;
  string->length = in_length;
  memcpy(__dest,in_string,in_length);
  return;
}

Assistant:

void
wpe_pasteboard_string_initialize(struct wpe_pasteboard_string* string, const char* in_string, uint64_t in_length)
{
    if (string->data)
        return;

    string->data = wpe_calloc(in_length, sizeof(char));
    string->length = in_length;
    memcpy(string->data, in_string, in_length);
}